

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::Matchers::StdString::EqualsMatcher::EqualsMatcher
          (EqualsMatcher *this,CasedString *comparator)

{
  undefined8 *in_RDI;
  CasedString *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  StringMatcherBase *in_stack_ffffffffffffffd0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd0,"equals",(allocator *)&stack0xffffffffffffffcf);
  StringMatcherBase::StringMatcherBase
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  *in_RDI = &PTR__EqualsMatcher_00277840;
  in_RDI[5] = &DAT_00277870;
  return;
}

Assistant:

EqualsMatcher::EqualsMatcher( CasedString const& comparator ) : StringMatcherBase( "equals", comparator ) {}